

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitRefCast(BinaryInstWriter *this,RefCast *curr)

{
  BufferWithRandomAccess *pBVar1;
  WasmBinaryWriter *this_00;
  bool bVar2;
  Exactness exactness;
  HeapType type;
  U32LEB local_20;
  U32LEB local_1c;
  RefCast *local_18;
  RefCast *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (RefCast *)this;
  BufferWithRandomAccess::operator<<(this->o,-5);
  bVar2 = wasm::Type::isNullable
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)63>).
                      super_Expression.type);
  if (bVar2) {
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0x17);
    BufferWithRandomAccess::operator<<(pBVar1,local_1c);
  }
  else {
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_20,0x16);
    BufferWithRandomAccess::operator<<(pBVar1,local_20);
  }
  this_00 = this->parent;
  type = wasm::Type::getHeapType
                   (&(local_18->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression
                     .type);
  exactness = wasm::Type::getExactness
                        (&(local_18->super_SpecificExpression<(wasm::Expression::Id)63>).
                          super_Expression.type);
  WasmBinaryWriter::writeHeapType(this_00,type,exactness);
  return;
}

Assistant:

void BinaryInstWriter::visitRefCast(RefCast* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  if (curr->type.isNullable()) {
    o << U32LEB(BinaryConsts::RefCastNull);
  } else {
    o << U32LEB(BinaryConsts::RefCast);
  }
  parent.writeHeapType(curr->type.getHeapType(), curr->type.getExactness());
}